

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gb.c
# Opt level: O3

void gb_update_noise_channel(gb_sound_t *gb,SOUND *snd,UINT32 cycles)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  
  uVar1 = *(int *)(gb_noise_period_cycles_divisor + (ulong)((uint)gb & 7) * 4) <<
          (sbyte)(((ulong)gb & 0xff) >> 4);
  uVar2 = cycles + snd->cycles_left;
  snd->cycles_left = uVar2;
  if (uVar1 <= uVar2) {
    uVar5 = (uint)snd->noise_lfsr;
    do {
      uVar2 = uVar2 - uVar1;
      uVar4 = uVar5 >> 1;
      uVar5 = (uVar4 ^ uVar5) & 1;
      uVar3 = uVar5 << 0xe;
      uVar5 = uVar5 << 6 | uVar3 | uVar4 & 0xffffffbf;
      if (snd->noise_short == false) {
        uVar5 = uVar3 | uVar4;
      }
    } while (uVar1 <= uVar2);
    snd->cycles_left = uVar2;
    snd->noise_lfsr = (UINT16)uVar5;
    snd->signal = -((byte)uVar5 & 1) | 1;
  }
  return;
}

Assistant:

static void gb_update_noise_channel(gb_sound_t *gb, struct SOUND *snd, UINT32 cycles)
{
	UINT32 period = gb_noise_period_cycles(gb);
	snd->cycles_left += cycles;
	while (snd->cycles_left >= period)
	{
		UINT16 feedback;
		snd->cycles_left -= period;

		// Using a Polynomial Counter (aka Linear Feedback Shift Register)
		// Mode 4 has a 15 bit counter so we need to shift the bits around accordingly.
		feedback = ((snd->noise_lfsr >> 1) ^ snd->noise_lfsr) & 1;
		snd->noise_lfsr = (snd->noise_lfsr >> 1) | (feedback << 14);
		if (snd->noise_short)
		{
			snd->noise_lfsr = (snd->noise_lfsr & ~(1 << 6)) | (feedback << 6);
		}
		snd->signal = (snd->noise_lfsr & 1) ? -1 : 1;
	}
}